

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::optimizeWithConstantOnLeft(OptimizeInstructions *this,Binary *curr)

{
  Type type;
  Expression *pEVar1;
  bool bVar2;
  BinaryOp BVar3;
  BinaryOp BVar4;
  Const *pCVar5;
  int64_t iVar6;
  anon_union_16_6_1532cd5a_for_Literal_0 local_250;
  undefined8 local_240;
  undefined8 local_230;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  local_f0;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  local_b0;
  undefined1 local_88 [40];
  Type local_60;
  Const *local_58;
  Expression *right;
  HeapType local_48;
  Const *c1;
  Const *c2;
  Expression *x;
  
  type.id = (curr->left->type).id;
  pCVar5 = Expression::cast<wasm::Const>(curr->left);
  if ((((ulong)curr->op < 0x28) && ((0xf800007c00U >> ((ulong)curr->op & 0x3f) & 1) != 0)) &&
     (bVar2 = Literal::isZero(&pCVar5->value), bVar2)) {
    effects((EffectAnalyzer *)&local_250.func,this,curr->right);
    bVar2 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)&local_250.func);
    EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&local_250.func);
    if (!bVar2) goto LAB_00ae3ceb;
  }
  BVar4 = curr->op;
  BVar3 = Abstract::getBinary(type,ShrS);
  if ((((BVar4 == BVar3) ||
       (BVar4 = curr->op, BVar3 = Abstract::getBinary(type,RotL), BVar4 == BVar3)) ||
      (BVar4 = curr->op, BVar3 = Abstract::getBinary(type,RotR), BVar4 == BVar3)) &&
     (iVar6 = Literal::getInteger(&pCVar5->value), iVar6 == -1)) {
    effects((EffectAnalyzer *)&local_250.func,this,curr->right);
    bVar2 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)&local_250.func);
    EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&local_250.func);
    if (!bVar2) {
LAB_00ae3ceb:
      return curr->left;
    }
  }
  local_240 = 0;
  local_230 = 0;
  local_250.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_48;
  local_58 = (Const *)&c2;
  local_88._16_8_ = &local_58;
  local_f0.submatchers.curr =
       (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
        *)0x0;
  local_f0.submatchers.next._8_8_ = 0;
  local_88._0_8_ = 0;
  local_f0.binder =
       (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_> *)
       &c1;
  local_88._8_4_ = 3;
  local_b0.binder =
       (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_> *)
       0x0;
  local_b0.data = Sub;
  local_b0.submatchers.curr =
       (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
        *)&local_250;
  local_b0.submatchers.next.curr =
       (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
        *)local_88;
  local_88._24_8_ = &local_f0;
  local_60.id = type.id;
  bVar2 = Match::Internal::
          Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
          ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
                     *)&local_b0,
                    (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                     )curr);
  if (bVar2) {
    Literal::sub((Literal *)&local_250.func,(Literal *)(local_48.id + 0x10),&c1->value);
    Literal::operator=(&pCVar5->value,(Literal *)&local_250.func);
    Literal::~Literal((Literal *)&local_250.func);
  }
  else {
    local_240 = 0;
    local_230 = 0;
    local_f0.submatchers.curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
          *)0x0;
    local_250.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_48;
    local_f0.submatchers.next._8_8_ = 0;
    local_f0.binder =
         (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
          *)&c1;
    local_88._0_8_ = 0;
    local_58 = (Const *)&c2;
    local_b0.data = Sub;
    local_b0.binder =
         (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
          *)0x0;
    local_88._24_8_ = &local_58;
    local_b0.submatchers.curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
          *)&local_250;
    local_b0.submatchers.next.curr =
         (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
          *)local_88;
    local_88._8_4_ = local_b0.data;
    local_88._16_8_ = &local_f0;
    bVar2 = Match::Internal::
            Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
            ::matches(&local_b0,
                      (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                       )curr);
    if (bVar2) {
      Literal::sub((Literal *)&local_250.func,(Literal *)(local_48.id + 0x10),&c1->value);
      Literal::operator=(&pCVar5->value,(Literal *)&local_250.func);
      Literal::~Literal((Literal *)&local_250.func);
      BVar4 = Abstract::getBinary(local_60,Add);
      curr->op = BVar4;
      pEVar1 = curr->left;
      curr->left = (Expression *)c2;
      curr->right = pEVar1;
      return (Expression *)curr;
    }
    local_240 = 0;
    local_230 = 0;
    local_250.i64 = 0;
    local_88._0_8_ = &local_58;
    local_b0.binder =
         (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
          *)0x0;
    local_b0.data = Neg;
    local_f0.binder =
         (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
          *)0x0;
    local_f0.data = DivS;
    local_f0.submatchers.curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
          *)&local_250;
    local_f0.submatchers.next.curr =
         (Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
          *)&local_b0;
    local_b0.submatchers.curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
          *)local_88;
    bVar2 = Match::Internal::
            Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
            ::matches(&local_f0,
                      (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                       )curr);
    if (!bVar2) {
      return (Expression *)0x0;
    }
    Literal::neg((Literal *)&local_250.func,&pCVar5->value);
    Literal::operator=(&pCVar5->value,(Literal *)&local_250.func);
    Literal::~Literal((Literal *)&local_250.func);
    c2 = local_58;
  }
  curr->right = (Expression *)c2;
  return (Expression *)curr;
}

Assistant:

Expression* optimizeWithConstantOnLeft(Binary* curr) {
    using namespace Match;
    using namespace Abstract;

    auto type = curr->left->type;
    auto* left = curr->left->cast<Const>();
    // 0 <<>> x   ==>   0
    if (Abstract::hasAnyShift(curr->op) && left->value.isZero() &&
        !effects(curr->right).hasSideEffects()) {
      return curr->left;
    }
    // (signed)-1 >> x   ==>   -1
    // rotl(-1, x)       ==>   -1
    // rotr(-1, x)       ==>   -1
    if ((curr->op == Abstract::getBinary(type, ShrS) ||
         curr->op == Abstract::getBinary(type, RotL) ||
         curr->op == Abstract::getBinary(type, RotR)) &&
        left->value.getInteger() == -1LL &&
        !effects(curr->right).hasSideEffects()) {
      return curr->left;
    }
    {
      // C1 - (x + C2)  ==>  (C1 - C2) - x
      Const *c1, *c2;
      Expression* x;
      if (matches(curr,
                  binary(Sub, ival(&c1), binary(Add, any(&x), ival(&c2))))) {
        left->value = c1->value.sub(c2->value);
        curr->right = x;
        return curr;
      }
      // C1 - (C2 - x)  ==>   x + (C1 - C2)
      if (matches(curr,
                  binary(Sub, ival(&c1), binary(Sub, ival(&c2), any(&x))))) {
        left->value = c1->value.sub(c2->value);
        curr->op = Abstract::getBinary(type, Add);
        curr->right = x;
        std::swap(curr->left, curr->right);
        return curr;
      }
    }
    {
      // fval(C) / -x   ==>  -C / x
      Expression* right;
      if (matches(curr, binary(DivS, fval(), unary(Neg, any(&right))))) {
        left->value = left->value.neg();
        curr->right = right;
        return curr;
      }
    }
    return nullptr;
  }